

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.h
# Opt level: O0

void sat_solver_set_polarity(sat_solver *s,int *pVars,int nVars)

{
  int local_20;
  int i;
  int nVars_local;
  int *pVars_local;
  sat_solver *s_local;
  
  for (local_20 = 0; local_20 < s->size; local_20 = local_20 + 1) {
    s->polarity[local_20] = '\0';
  }
  for (local_20 = 0; local_20 < nVars; local_20 = local_20 + 1) {
    s->polarity[pVars[local_20]] = '\x01';
  }
  return;
}

Assistant:

static inline void sat_solver_set_polarity(sat_solver* s, int * pVars, int nVars )
{
    int i;
    for ( i = 0; i < s->size; i++ )
        s->polarity[i] = 0;
    for ( i = 0; i < nVars; i++ )
        s->polarity[pVars[i]] = 1;
}